

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.h
# Opt level: O0

void __thiscall
mp::
FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
::PropagateObjContexts
          (FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
           *this)

{
  Type TVar1;
  int iVar2;
  CtxVal v;
  ObjList *this_00;
  Env *pEVar3;
  double dVar4;
  reference pvVar5;
  double *pdVar6;
  FlatModel<mp::DefaultFlatModelParams> *in_RDI;
  CtxVal ctx;
  bool isMax;
  size_t i;
  ArrayRef<double> objwgt;
  ObjList *objs;
  QuadTerms *in_stack_ffffffffffffffa0;
  ConstraintPropagatorsDown<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  Context in_stack_ffffffffffffffb4;
  uint in_stack_ffffffffffffffbc;
  double dVar7;
  double __n;
  MOManager<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_stack_ffffffffffffffd8;
  
  this_00 = FlatModel<mp::DefaultFlatModelParams>::get_objectives(in_RDI);
  MOManager<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::GetMOWeights(in_stack_ffffffffffffffd8);
  pEVar3 = EnvKeeper::GetEnv((EnvKeeper *)
                             &in_RDI[1].var_result_.super__Bvector_base<std::allocator<bool>_>.
                              _M_impl.super__Bvector_impl_data._M_finish);
  BasicSolver::multiobj(pEVar3);
  dVar7 = 0.0;
  while (__n = dVar7,
        dVar4 = (double)std::vector<mp::QuadraticObjective,_std::allocator<mp::QuadraticObjective>_>
                        ::size(this_00), (ulong)dVar7 < (ulong)dVar4) {
    pvVar5 = std::vector<mp::QuadraticObjective,_std::allocator<mp::QuadraticObjective>_>::
             operator[](this_00,(size_type)__n);
    TVar1 = LinearObjective::obj_sense((LinearObjective *)pvVar5);
    in_stack_ffffffffffffffbc = CONCAT13(TVar1 == MAX,(int3)in_stack_ffffffffffffffbc);
    pEVar3 = EnvKeeper::GetEnv((EnvKeeper *)
                               &in_RDI[1].var_result_.super__Bvector_base<std::allocator<bool>_>.
                                _M_impl.super__Bvector_impl_data._M_finish);
    iVar2 = BasicSolver::multiobj(pEVar3);
    if ((iVar2 != 0) &&
       (pdVar6 = ArrayRef<double>::operator[]
                           ((ArrayRef<double> *)&stack0xffffffffffffffc8,(size_t)__n),
       *pdVar6 <= 0.0 && *pdVar6 != 0.0)) {
      in_stack_ffffffffffffffbc = (in_stack_ffffffffffffffbc ^ 0xff000000) & 0x1ffffff;
      pvVar5 = std::vector<mp::QuadraticObjective,_std::allocator<mp::QuadraticObjective>_>::
               operator[](this_00,(size_type)__n);
      LinearObjective::set_sense_true
                ((LinearObjective *)pvVar5,(uint)((in_stack_ffffffffffffffbc & 0x1000000) != 0));
    }
    v = in_stack_ffffffffffffffbc >> 0x18 & CTX_ROOT ^ CTX_NEG;
    pvVar5 = std::vector<mp::QuadraticObjective,_std::allocator<mp::QuadraticObjective>_>::
             operator[](this_00,(size_type)__n);
    LinearObjective::GetLinTerms((LinearObjective *)pvVar5);
    BasicFlatConverter::MinusInfty();
    BasicFlatConverter::Infty();
    Context::Context((Context *)&stack0xffffffffffffffb4,v);
    ConstraintPropagatorsDown<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::PropagateResult2LinTerms
              ((ConstraintPropagatorsDown<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                *)CONCAT44(in_stack_ffffffffffffffbc,v),
               (LinTerms *)CONCAT44(in_stack_ffffffffffffffb4.value_,in_stack_ffffffffffffffb0),
               (double)in_stack_ffffffffffffffa8,(double)in_stack_ffffffffffffffa0,
               (Context)(CtxVal)((ulong)__n >> 0x20));
    pvVar5 = std::vector<mp::QuadraticObjective,_std::allocator<mp::QuadraticObjective>_>::
             operator[](this_00,(size_type)__n);
    QuadraticObjective::GetQPTerms(pvVar5);
    BasicFlatConverter::MinusInfty();
    BasicFlatConverter::Infty();
    Context::Context((Context *)&stack0xffffffffffffffa0,v);
    ConstraintPropagatorsDown<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::PropagateResult2QuadTerms
              (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,(double)in_RDI,dVar7,
               in_stack_ffffffffffffffb4);
    dVar7 = (double)((long)__n + 1);
  }
  ArrayRef<double>::~ArrayRef((ArrayRef<double> *)0x613969);
  return;
}

Assistant:

void PropagateObjContexts() {
    auto& objs = MPD( get_objectives() );
    const auto objwgt = MPD( GetMOWeights() );
    if (GetEnv().multiobj())               // only in obj:multi mode
      assert(objs.size() == objwgt.size());
    for (size_t i=0; i<objs.size(); ++i) {
      auto isMax = obj::MAX==objs[i].obj_sense();
      if (GetEnv().multiobj() && objwgt[i]<0.0) {  // only in obj:multi
        isMax = !isMax;
        objs[i].set_sense_true(isMax ? obj::MAX : obj::MIN);
      }
      auto ctx = isMax ? Context::CTX_POS : Context::CTX_NEG;
      MPD( PropagateResult2LinTerms(objs[i].GetLinTerms(),
                          MPD( MinusInfty() ), MPD( Infty() ), ctx) );
      MPD( PropagateResult2QuadTerms(objs[i].GetQPTerms(),
                          MPD( MinusInfty() ), MPD( Infty() ), ctx) );
    }
  }